

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

bool xercesc_4_0::XMLString::isWSReplaced(XMLCh *toCheck)

{
  XMLCh XVar1;
  byte bVar2;
  XMLCh *pXVar3;
  
  bVar2 = 1;
  if ((toCheck != (XMLCh *)0x0) && (XVar1 = *toCheck, XVar1 != L'\0')) {
    pXVar3 = toCheck + 1;
    while ((0xd < (ushort)XVar1 || ((0x2601U >> ((ushort)XVar1 & 0x1f) & 1) == 0))) {
      XVar1 = *pXVar3;
      pXVar3 = pXVar3 + 1;
    }
    bVar2 = (byte)(0x19ff >> ((byte)XVar1 & 0x1f));
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool XMLString::isWSReplaced(const XMLCh* const toCheck)
{
    // If no string, then its a OK
    if (( !toCheck ) || ( !*toCheck ))
        return true;

    const XMLCh* startPtr = toCheck;
    while ( *startPtr )
    {
        if ( ( *startPtr == chCR) ||
             ( *startPtr == chLF) ||
             ( *startPtr == chHTab))
        return false;

        startPtr++;
    }

    return true;
}